

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

int __thiscall CInput::Update(CInput *this)

{
  char *dst;
  int iVar1;
  int iVar2;
  void *source;
  int i;
  char *pText;
  undefined4 Key;
  undefined4 uVar3;
  long in_FS_OFFSET;
  int NumKeyStates;
  SDL_Event Event;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_InputCounter = this->m_InputCounter % 0xffff + 1;
  source = (void *)SDL_GetKeyboardState(&NumKeyStates);
  if (0x19a < NumKeyStates) {
    NumKeyStates = 0x19b;
  }
  mem_copy(this->m_aInputState,source,NumKeyStates);
  mem_zero(this->m_aInputState + NumKeyStates,0x1da - NumKeyStates);
  UpdateMouseState(this);
  UpdateJoystickState(this);
  dst = this->m_aComposition;
switchD_00121e8d_default:
  iVar1 = SDL_PollEvent(&Event);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (this->m_CompositionLength == 0) {
      this->m_CompositionLength = -1;
    }
    goto LAB_00121fea;
  }
  iVar1 = 1;
  switch(Event.type) {
  case 0x301:
    iVar1 = 2;
  case 0x300:
    Key = Event.window.data2 + 0xc0000080;
    if (((uint)Event.window.data2 >> 0x1e & 1) == 0) {
      Key = Event.window.data2;
    }
    uVar3 = Event.display.data1;
    if ((int)Key < 0) goto switchD_00121e8d_default;
    break;
  case 0x302:
    iVar1 = str_length(Event.edit.text);
    this->m_CompositionLength = iVar1;
    if (iVar1 != 0) {
      str_copy(dst,Event.edit.text,0x20);
      this->m_CompositionCursor = 0;
      iVar1 = 0;
      for (iVar2 = 0; iVar2 < Event.edit.start; iVar2 = iVar2 + 1) {
        iVar1 = str_utf8_forward(dst,iVar1);
        this->m_CompositionCursor = iVar1;
      }
      for (iVar2 = 0; iVar2 < Event.edit.length; iVar2 = iVar2 + 1) {
        iVar1 = str_utf8_forward(dst,iVar1);
      }
      this->m_CompositionSelectedLength = iVar1 - this->m_CompositionCursor;
      pText = (char *)0x0;
      goto LAB_00121ed5;
    }
    this->m_aComposition[0] = '\0';
    this->m_CompositionLength = 0;
    this->m_CompositionCursor = 0;
    this->m_CompositionSelectedLength = 0;
    goto switchD_00121e8d_default;
  case 0x303:
    this->m_aComposition[0] = '\0';
    this->m_CompositionLength = -1;
    this->m_CompositionCursor = 0;
    this->m_CompositionSelectedLength = 0;
    pText = Event.edit.text;
LAB_00121ed5:
    AddEvent(this,pText,0,8);
    goto switchD_00121e8d_default;
  default:
    if (Event.type - 0x603 < 2) {
      HandleJoystickButtonEvent(this,&Event);
      goto switchD_00121e8d_default;
    }
    iVar1 = 1;
    if (Event.type == 0x401) {
LAB_00121e63:
      Key = 0x19c;
      uVar3 = 0x19c;
      switch(Event.key.keysym.scancode & (SDL_SCANCODE_LCTRL|SDL_SCANCODE_2)) {
      case 1:
        if ((Event.key.keysym.scancode & 0x10000) == SDL_SCANCODE_UNKNOWN) {
          this->m_MouseDoubleClick = true;
        }
        else if (Event.edit.text[6] == '\x01') {
          this->m_MouseDoubleClick = false;
        }
        Key = 0x19b;
        uVar3 = 0x19b;
        break;
      case 2:
        Key = 0x19d;
        uVar3 = 0x19d;
        break;
      case 3:
        break;
      case SDL_SCANCODE_A:
        Key = 0x19e;
        uVar3 = 0x19e;
        break;
      case SDL_SCANCODE_B:
        Key = 0x19f;
        uVar3 = 0x19f;
        break;
      case SDL_SCANCODE_C:
        Key = 0x1a0;
        uVar3 = 0x1a0;
        break;
      case SDL_SCANCODE_D:
        Key = 0x1a1;
        uVar3 = 0x1a1;
        break;
      case SDL_SCANCODE_E:
        Key = 0x1a2;
        uVar3 = 0x1a2;
        break;
      case SDL_SCANCODE_F:
        Key = 0x1a3;
        uVar3 = 0x1a3;
        break;
      default:
        goto switchD_00121e8d_default;
      }
    }
    else {
      if (Event.type == 0x402) {
        iVar1 = 2;
        goto LAB_00121e63;
      }
      if (Event.type != 0x403) {
        if (Event.type == 0x600) {
          HandleJoystickAxisMotionEvent(this,&Event);
        }
        else {
          if (Event.type != 0x602) goto code_r0x00121d41;
          HandleJoystickHatMotionEvent(this,&Event);
        }
        goto switchD_00121e8d_default;
      }
      iVar1 = 3;
      Key = 0x1a4;
      uVar3 = 0x1a4;
      if (0 < Event.window.data2) break;
      if (-1 < Event.window.data2) goto switchD_00121e8d_default;
      Key = 0x1a5;
      uVar3 = 0x1a5;
    }
  }
  iVar2 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[0x12])(this);
  if ((char)iVar2 == '\0') {
    if (((uint)uVar3 < SDL_NUM_SCANCODES & (byte)iVar1 & (uint)Key < 0x200) == 1) {
      this->m_aInputState[(uint)uVar3] = true;
      this->m_aInputCount[(uint)Key] = (unsigned_short)this->m_InputCounter;
    }
    AddEvent(this,(char *)0x0,Key,iVar1);
  }
  goto switchD_00121e8d_default;
code_r0x00121d41:
  if (Event.type == 0x100) {
    iVar1 = 1;
LAB_00121fea:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return iVar1;
  }
  goto switchD_00121e8d_default;
}

Assistant:

int CInput::Update()
{
	// keep the counter between 1..0xFFFF, 0 means not pressed
	m_InputCounter = (m_InputCounter%0xFFFF)+1;

	int NumKeyStates;
	const Uint8 *pState = SDL_GetKeyboardState(&NumKeyStates);
	if(NumKeyStates >= KEY_MOUSE_1)
		NumKeyStates = KEY_MOUSE_1;
	mem_copy(m_aInputState, pState, NumKeyStates);
	mem_zero(m_aInputState+NumKeyStates, KEY_LAST-NumKeyStates);

	// these states must always be updated manually because they are not in the SDL_GetKeyboardState from SDL
	UpdateMouseState();
	UpdateJoystickState();

	SDL_Event Event;
	while(SDL_PollEvent(&Event))
	{
		int Key = -1;
		int Scancode = -1;
		int Action = IInput::FLAG_PRESS;
		switch(Event.type)
		{
			// handle text editing candidate
			case SDL_SYSWMEVENT:
				ProcessSystemMessage(Event.syswm.msg);
				break;

			// handle on the spot text editing
			case SDL_TEXTEDITING:
			{
				m_CompositionLength = str_length(Event.edit.text);
				if(m_CompositionLength)
				{
					str_copy(m_aComposition, Event.edit.text, sizeof(m_aComposition));
					m_CompositionCursor = 0;
					for(int i = 0; i < Event.edit.start; i++)
						m_CompositionCursor = str_utf8_forward(m_aComposition, m_CompositionCursor);
					int CompositionEnd = m_CompositionCursor;
					for(int i = 0; i < Event.edit.length; i++)
						CompositionEnd = str_utf8_forward(m_aComposition, CompositionEnd);
					m_CompositionSelectedLength = CompositionEnd - m_CompositionCursor;
					AddEvent(0, 0, IInput::FLAG_TEXT);
				}
				else
				{
					m_aComposition[0] = '\0';
					m_CompositionLength = 0;
					m_CompositionCursor = 0;
					m_CompositionSelectedLength = 0;
				}
				break;
			}
			case SDL_TEXTINPUT:
				m_aComposition[0] = 0;
				m_CompositionLength = COMP_LENGTH_INACTIVE;
				m_CompositionCursor = 0;
				m_CompositionSelectedLength = 0;
				AddEvent(Event.text.text, 0, IInput::FLAG_TEXT);
				break;

			// handle keys
			case SDL_KEYUP:
				Action = IInput::FLAG_RELEASE;

				// fall through
			case SDL_KEYDOWN:
				Key = KeycodeToKey(Event.key.keysym.sym);
				Scancode = Event.key.keysym.scancode;
				break;

			// handle the joystick events
			case SDL_JOYAXISMOTION:
				HandleJoystickAxisMotionEvent(Event);
				break;

			case SDL_JOYBUTTONUP:
			case SDL_JOYBUTTONDOWN:
				HandleJoystickButtonEvent(Event);
				break;

			case SDL_JOYHATMOTION:
				HandleJoystickHatMotionEvent(Event);
				break;

			// handle mouse buttons
			case SDL_MOUSEBUTTONUP:
				Action = IInput::FLAG_RELEASE;

				// fall through
			case SDL_MOUSEBUTTONDOWN:
				if(Event.button.button == SDL_BUTTON_LEFT) // ignore_convention
				{
					Key = KEY_MOUSE_1;
					if(Event.button.clicks%2 == 0)
						m_MouseDoubleClick = true;
					else if(Event.button.clicks == 1)
						m_MouseDoubleClick = false;
				}
				else if(Event.button.button == SDL_BUTTON_RIGHT) Key = KEY_MOUSE_2; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_MIDDLE) Key = KEY_MOUSE_3; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_X1) Key = KEY_MOUSE_4; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_X2) Key = KEY_MOUSE_5; // ignore_convention
				else if(Event.button.button == 6) Key = KEY_MOUSE_6; // ignore_convention
				else if(Event.button.button == 7) Key = KEY_MOUSE_7; // ignore_convention
				else if(Event.button.button == 8) Key = KEY_MOUSE_8; // ignore_convention
				else if(Event.button.button == 9) Key = KEY_MOUSE_9; // ignore_convention
				Scancode = Key;
				break;

			case SDL_MOUSEWHEEL:
				if(Event.wheel.y > 0) Key = KEY_MOUSE_WHEEL_UP; // ignore_convention
				else if(Event.wheel.y < 0) Key = KEY_MOUSE_WHEEL_DOWN; // ignore_convention
				else break;
				Action |= IInput::FLAG_RELEASE;
				Scancode = Key;
				break;

#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (mouse state is faulty on start)
			case SDL_WINDOWEVENT:
				if(Event.window.event == SDL_WINDOWEVENT_MAXIMIZED)
				{
					MouseModeAbsolute();
					MouseModeRelative();
				}
				break;
#endif

			// other messages
			case SDL_QUIT:
				return 1;
		}

		if(Key >= 0 && !HasComposition())
		{
			if((Action&IInput::FLAG_PRESS) && Key < g_MaxKeys && Scancode >= 0 && Scancode < g_MaxKeys)
			{
				m_aInputState[Scancode] = true;
				m_aInputCount[Key] = m_InputCounter;
			}
			AddEvent(0, Key, Action);
		}
	}

	if(m_CompositionLength == 0)
		m_CompositionLength = COMP_LENGTH_INACTIVE;

	return 0;
}